

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 ImGui::FindBestWindowPosForPopupEx
                 (ImVec2 *ref_pos,ImVec2 *size,ImGuiDir *last_dir,ImRect *r_outer,ImRect *r_avoid,
                 ImGuiPopupPositionPolicy policy)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  int *piVar8;
  uint *puVar9;
  uint *puVar10;
  long lVar11;
  int *piVar12;
  ImVec2 IVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  ImVec2 local_58;
  ImRect local_40;
  undefined1 extraout_var [56];
  
  auVar14._8_8_ = 0;
  auVar14._0_4_ = (r_outer->Max).x;
  auVar14._4_4_ = (r_outer->Max).y;
  auVar20._8_8_ = 0;
  auVar20._0_4_ = size->x;
  auVar20._4_4_ = size->y;
  auVar14 = vsubps_avx(auVar14,auVar20);
  auVar19._0_8_ = ImClamp(ref_pos,&r_outer->Min,auVar14._0_8_);
  auVar19._8_56_ = extraout_var;
  auVar14 = auVar19._0_16_;
  if (policy == ImGuiPopupPositionPolicy_ComboBox) {
    piVar12 = (int *)(&DAT_001d4a20 + (ulong)(*last_dir != -1) * -4);
    for (lVar11 = -4 - (ulong)(*last_dir != -1); lVar11 != 0; lVar11 = lVar11 + 1) {
      piVar8 = piVar12;
      if (lVar11 == -5) {
        piVar8 = last_dir;
      }
      iVar4 = *piVar8;
      if ((lVar11 == -5) || (iVar4 != *last_dir)) {
        switch(iVar4) {
        case 0:
          auVar20 = vinsertps_avx(ZEXT416((uint)((r_avoid->Max).x - size->x)),
                                  ZEXT416((uint)(r_avoid->Max).y),0x10);
          break;
        case 1:
          auVar20 = vinsertps_avx((undefined1  [16])*r_avoid,
                                  ZEXT416((uint)((r_avoid->Min).y - size->y)),0x10);
          break;
        case 2:
          auVar15._8_8_ = 0;
          auVar15._0_8_ = *(ulong *)&(r_avoid->Min).y;
          auVar20 = vshufps_avx(auVar15,auVar15,0xe1);
          auVar21._8_8_ = 0;
          auVar21._0_4_ = size->x;
          auVar21._4_4_ = size->y;
          auVar20 = vsubps_avx(auVar20,auVar21);
          break;
        case 3:
          auVar20 = vpermilps_avx((undefined1  [16])*r_avoid,0xec);
          break;
        default:
          auVar20 = ZEXT816(0) << 0x40;
        }
        auVar16._0_4_ = auVar20._0_4_ + (*size).x;
        auVar16._4_4_ = auVar20._4_4_ + (*size).y;
        auVar16._8_4_ = auVar20._8_4_ + 0.0;
        auVar16._12_4_ = auVar20._12_4_ + 0.0;
        local_40 = (ImRect)vmovlhps_avx(auVar20,auVar16);
        bVar7 = ImRect::Contains(r_outer,&local_40);
        if (bVar7) {
          *last_dir = iVar4;
          local_58 = auVar20._0_8_;
          return local_58;
        }
      }
      piVar12 = piVar12 + 1;
    }
  }
  if ((policy & ~ImGuiPopupPositionPolicy_Tooltip) == ImGuiPopupPositionPolicy_Default) {
    uVar5 = *last_dir;
    fVar1 = (r_avoid->Min).y;
    fVar2 = (r_avoid->Max).x;
    fVar3 = (r_avoid->Max).y;
    auVar17._8_8_ = 0;
    auVar17._0_4_ = (r_outer->Min).x;
    auVar17._4_4_ = (r_outer->Min).y;
    auVar20 = vmovshdup_avx(auVar17);
    puVar10 = (uint *)(&DAT_001da7f0 + (ulong)(uVar5 != 0xffffffff) * -4);
    for (lVar11 = -4 - (ulong)(uVar5 != 0xffffffff); lVar11 != 0; lVar11 = lVar11 + 1) {
      puVar9 = (uint *)last_dir;
      if (lVar11 != -5) {
        puVar9 = puVar10;
      }
      uVar6 = *puVar9;
      if ((lVar11 == -5) || (uVar6 != uVar5)) {
        fVar25 = (r_avoid->Min).x;
        if (uVar6 != 0) {
          fVar25 = (r_outer->Max).x;
        }
        auVar15 = ZEXT416((uint)fVar2);
        if (uVar6 != 1) {
          auVar15 = auVar17;
        }
        if (size->x <= fVar25 - auVar15._0_4_ || 1 < uVar6) {
          fVar25 = fVar1;
          if (uVar6 != 2) {
            fVar25 = (r_outer->Max).y;
          }
          fVar26 = fVar3;
          if (uVar6 != 3) {
            fVar26 = auVar20._0_4_;
          }
          if ((size->y <= fVar25 - fVar26) || ((uVar6 & 0xfffffffe) != 2)) {
            if (uVar6 == 0) {
              auVar20 = ZEXT416((uint)((r_avoid->Min).x - size->x));
            }
            else {
              auVar20 = ZEXT416((uint)fVar2);
              if (uVar6 != 1) {
                if (uVar6 == 2) {
                  auVar14 = vinsertps_avx(auVar14,ZEXT416((uint)(fVar1 - size->y)),0x10);
                  goto LAB_00153125;
                }
                auVar20 = auVar14;
                if (uVar6 == 3) {
                  auVar14 = vinsertps_avx(auVar14,ZEXT416((uint)fVar3),0x10);
                  goto LAB_00153125;
                }
              }
            }
            auVar14 = vblendps_avx(auVar20,auVar14,0xe);
LAB_00153125:
            auVar20 = vcmpps_avx(auVar17,auVar14,2);
            auVar14 = vblendvps_avx(auVar17,auVar14,auVar20);
            *last_dir = uVar6;
            return auVar14._0_8_;
          }
        }
      }
      puVar10 = puVar10 + 1;
    }
  }
  *last_dir = -1;
  if (policy == ImGuiPopupPositionPolicy_Tooltip) {
    IVar13.x = (*ref_pos).x + 2.0;
    IVar13.y = (*ref_pos).y + 2.0;
  }
  else {
    IVar13 = *size;
    auVar22._8_8_ = 0;
    auVar22._0_4_ = IVar13.x;
    auVar22._4_4_ = IVar13.y;
    auVar18._0_4_ = (*ref_pos).x + IVar13.x;
    auVar18._4_4_ = (*ref_pos).y + IVar13.y;
    auVar18._8_8_ = 0;
    auVar23._8_8_ = 0;
    auVar23._0_4_ = (r_outer->Min).x;
    auVar23._4_4_ = (r_outer->Min).y;
    auVar24._8_8_ = 0;
    auVar24._0_4_ = (r_outer->Max).x;
    auVar24._4_4_ = (r_outer->Max).y;
    auVar14 = vminps_avx(auVar18,auVar24);
    auVar20 = vsubps_avx(auVar14,auVar22);
    auVar14 = vcmpps_avx(auVar23,auVar20,2);
    auVar14 = vblendvps_avx(auVar23,auVar20,auVar14);
    IVar13 = auVar14._0_8_;
  }
  return IVar13;
}

Assistant:

ImVec2 ImGui::FindBestWindowPosForPopupEx(const ImVec2& ref_pos, const ImVec2& size, ImGuiDir* last_dir, const ImRect& r_outer, const ImRect& r_avoid, ImGuiPopupPositionPolicy policy)
{
    ImVec2 base_pos_clamped = ImClamp(ref_pos, r_outer.Min, r_outer.Max - size);
    //GetForegroundDrawList()->AddRect(r_avoid.Min, r_avoid.Max, IM_COL32(255,0,0,255));
    //GetForegroundDrawList()->AddRect(r_outer.Min, r_outer.Max, IM_COL32(0,255,0,255));

    // Combo Box policy (we want a connecting edge)
    if (policy == ImGuiPopupPositionPolicy_ComboBox)
    {
        const ImGuiDir dir_prefered_order[ImGuiDir_COUNT] = { ImGuiDir_Down, ImGuiDir_Right, ImGuiDir_Left, ImGuiDir_Up };
        for (int n = (*last_dir != ImGuiDir_None) ? -1 : 0; n < ImGuiDir_COUNT; n++)
        {
            const ImGuiDir dir = (n == -1) ? *last_dir : dir_prefered_order[n];
            if (n != -1 && dir == *last_dir) // Already tried this direction?
                continue;
            ImVec2 pos;
            if (dir == ImGuiDir_Down)  pos = ImVec2(r_avoid.Min.x, r_avoid.Max.y);          // Below, Toward Right (default)
            if (dir == ImGuiDir_Right) pos = ImVec2(r_avoid.Min.x, r_avoid.Min.y - size.y); // Above, Toward Right
            if (dir == ImGuiDir_Left)  pos = ImVec2(r_avoid.Max.x - size.x, r_avoid.Max.y); // Below, Toward Left
            if (dir == ImGuiDir_Up)    pos = ImVec2(r_avoid.Max.x - size.x, r_avoid.Min.y - size.y); // Above, Toward Left
            if (!r_outer.Contains(ImRect(pos, pos + size)))
                continue;
            *last_dir = dir;
            return pos;
        }
    }

    // Tooltip and Default popup policy
    // (Always first try the direction we used on the last frame, if any)
    if (policy == ImGuiPopupPositionPolicy_Tooltip || policy == ImGuiPopupPositionPolicy_Default)
    {
        const ImGuiDir dir_prefered_order[ImGuiDir_COUNT] = { ImGuiDir_Right, ImGuiDir_Down, ImGuiDir_Up, ImGuiDir_Left };
        for (int n = (*last_dir != ImGuiDir_None) ? -1 : 0; n < ImGuiDir_COUNT; n++)
        {
            const ImGuiDir dir = (n == -1) ? *last_dir : dir_prefered_order[n];
            if (n != -1 && dir == *last_dir) // Already tried this direction?
                continue;

            const float avail_w = (dir == ImGuiDir_Left ? r_avoid.Min.x : r_outer.Max.x) - (dir == ImGuiDir_Right ? r_avoid.Max.x : r_outer.Min.x);
            const float avail_h = (dir == ImGuiDir_Up ? r_avoid.Min.y : r_outer.Max.y) - (dir == ImGuiDir_Down ? r_avoid.Max.y : r_outer.Min.y);

            // If there not enough room on one axis, there's no point in positioning on a side on this axis (e.g. when not enough width, use a top/bottom position to maximize available width)
            if (avail_w < size.x && (dir == ImGuiDir_Left || dir == ImGuiDir_Right))
                continue;
            if (avail_h < size.y && (dir == ImGuiDir_Up || dir == ImGuiDir_Down))
                continue;

            ImVec2 pos;
            pos.x = (dir == ImGuiDir_Left) ? r_avoid.Min.x - size.x : (dir == ImGuiDir_Right) ? r_avoid.Max.x : base_pos_clamped.x;
            pos.y = (dir == ImGuiDir_Up) ? r_avoid.Min.y - size.y : (dir == ImGuiDir_Down) ? r_avoid.Max.y : base_pos_clamped.y;

            // Clamp top-left corner of popup
            pos.x = ImMax(pos.x, r_outer.Min.x);
            pos.y = ImMax(pos.y, r_outer.Min.y);

            *last_dir = dir;
            return pos;
        }
    }

    // Fallback when not enough room:
    *last_dir = ImGuiDir_None;

    // For tooltip we prefer avoiding the cursor at all cost even if it means that part of the tooltip won't be visible.
    if (policy == ImGuiPopupPositionPolicy_Tooltip)
        return ref_pos + ImVec2(2, 2);

    // Otherwise try to keep within display
    ImVec2 pos = ref_pos;
    pos.x = ImMax(ImMin(pos.x + size.x, r_outer.Max.x) - size.x, r_outer.Min.x);
    pos.y = ImMax(ImMin(pos.y + size.y, r_outer.Max.y) - size.y, r_outer.Min.y);
    return pos;
}